

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavMoveRequestResolveWithLastItem(void)

{
  bool *pbVar1;
  ImGuiContext_conflict1 *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->NavMoveScoringItems = false;
  NavApplyItemToResult(&pIVar2->NavMoveResultLocal);
  pIVar2 = GImGui;
  if (GImGui->NavMoveScoringItems == false) {
    pbVar1 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar1;
    if (*pbVar1 == false) {
      return;
    }
  }
  else {
    GImGui->NavAnyRequest = true;
  }
  if (pIVar2->NavWindow != (ImGuiWindow_conflict *)0x0) {
    return;
  }
  __assert_fail("g.NavWindow != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x2664,"void ImGui::NavUpdateAnyRequestFlag()");
}

Assistant:

void ImGui::NavMoveRequestResolveWithLastItem()
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false; // Ensure request doesn't need more processing
    NavApplyItemToResult(&g.NavMoveResultLocal);
    NavUpdateAnyRequestFlag();
}